

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O3

int __thiscall
FFlatVertexBuffer::CreateVertices
          (FFlatVertexBuffer *this,int h,sector_t *sec,secplane_t *plane,int floor)

{
  sector_t *psVar1;
  extsector_t *peVar2;
  F3DFloor *pFVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  extsector_t *peVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  sec->vboheight[h] = sec->planes[h].TexZ;
  iVar4 = CreateSectorVertices(this,sec,plane,floor);
  sec->vboindex[h] = iVar4;
  peVar8 = sec->e;
  if ((peVar8->FakeFloor).Sectors.Count != 0) {
    uVar9 = 0;
    do {
      psVar1 = (peVar8->FakeFloor).Sectors.Array[uVar9];
      iVar4 = CreateSectorVertices(this,psVar1,plane,0);
      psVar1->vboindex[h + 2] = iVar4;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (peVar8->FakeFloor).Sectors.Count);
    peVar8 = sec->e;
  }
  uVar5 = (peVar8->XFloor).attached.Count;
  if (uVar5 != 0) {
    uVar9 = 0;
    do {
      psVar1 = (peVar8->XFloor).attached.Array[uVar9];
      peVar2 = psVar1->e;
      uVar6 = (ulong)(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          pFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar7];
          if (pFVar3->model == sec) {
            if ((pFVar3->flags & 8) != 0) {
              if ((pFVar3->top).model == sec) {
                bVar10 = (pFVar3->top).isceiling == h;
              }
              else {
                bVar10 = false;
              }
              if ((pFVar3->bottom).model == sec) {
                bVar11 = (pFVar3->bottom).isceiling == h;
              }
              else {
                bVar11 = false;
              }
              if ((bool)(bVar10 | bVar11)) {
                if (bVar10) {
                  (pFVar3->top).vindex = (this->vbo_shadowdata).Count;
                }
                if (bVar11) {
                  (pFVar3->bottom).vindex = (this->vbo_shadowdata).Count;
                }
                CreateSectorVertices(this,psVar1,plane,0);
                uVar5 = (peVar8->XFloor).attached.Count;
              }
            }
            break;
          }
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar5);
  }
  sec->vbocount[h] = (this->vbo_shadowdata).Count - sec->vboindex[h];
  return sec->vboindex[h];
}

Assistant:

int FFlatVertexBuffer::CreateVertices(int h, sector_t *sec, const secplane_t &plane, int floor)
{
	// First calculate the vertices for the sector itself
	sec->vboheight[h] = sec->GetPlaneTexZ(h);
	sec->vboindex[h] = CreateSectorVertices(sec, plane, floor);

	// Next are all sectors using this one as heightsec
	TArray<sector_t *> &fakes = sec->e->FakeFloor.Sectors;
	for (unsigned g=0; g<fakes.Size(); g++)
	{
		sector_t *fsec = fakes[g];
		fsec->vboindex[2+h] = CreateSectorVertices(fsec, plane, false);
	}

	// and finally all attached 3D floors
	TArray<sector_t *> &xf = sec->e->XFloor.attached;
	for (unsigned g=0; g<xf.Size(); g++)
	{
		sector_t *fsec = xf[g];
		F3DFloor *ffloor = Find3DFloor(fsec, sec);

		if (ffloor != NULL && ffloor->flags & FF_RENDERPLANES)
		{
			bool dotop = (ffloor->top.model == sec) && (ffloor->top.isceiling == h);
			bool dobottom = (ffloor->bottom.model == sec) && (ffloor->bottom.isceiling == h);

			if (dotop || dobottom)
			{
				if (dotop) ffloor->top.vindex = vbo_shadowdata.Size();
				if (dobottom) ffloor->bottom.vindex = vbo_shadowdata.Size();
	
				CreateSectorVertices(fsec, plane, false);
			}
		}
	}
	sec->vbocount[h] = vbo_shadowdata.Size() - sec->vboindex[h];
	return sec->vboindex[h];
}